

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderAtomicExchangeCase::verify
          (ShaderAtomicExchangeCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  _Rb_tree_header *p_Var1;
  ostringstream *poVar2;
  int iVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  ulong uVar8;
  undefined1 uVar9;
  int iVar10;
  uint uVar11;
  undefined8 unaff_RBP;
  undefined7 uVar13;
  uint uVar14;
  int in_stack_00000008;
  int outputValue;
  long in_stack_00000010;
  set<int,_std::less<int>,_std::allocator<int>_> usedValues;
  uint local_20c;
  ulong local_208;
  int local_1fc;
  ulong local_1f8;
  ulong local_1f0;
  size_t local_1e8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  ulong uVar12;
  
  local_1fc = (int)tbs;
  uVar14 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  lVar5 = 0;
  do {
    uVar14 = uVar14 * (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[lVar5 + 1];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 2);
  local_1f8 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)uVar14;
  iVar3 = (int)local_1f8;
  uVar12 = CONCAT71((int7)((ulong)unaff_RBP >> 8),iVar3 < 1);
  iVar10 = (int)uVar12;
  if (0 < iVar3) {
    p_Var1 = &local_1e0._M_impl.super__Rb_tree_header;
    local_1f8 = local_1f8 & 0xffffffff;
    local_1f0 = (ulong)uVar14;
    local_208 = 0;
    local_1e8 = tbslen;
    do {
      uVar9 = (undefined1)uVar12;
      iVar3 = *(int *)(in_stack_00000010 + (int)local_208 * in_stack_00000008);
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_1e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      if (0 < (int)uVar14) {
        uVar11 = uVar14 * (int)local_208;
        uVar12 = (ulong)uVar11;
        uVar8 = 0;
        do {
          local_20c = *(uint *)(local_1e8 + (long)(int)(((int)uVar8 + uVar11) * local_1fc));
          p_Var4 = &p_Var1->_M_header;
          p_Var6 = local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (uVar14 < local_20c) {
LAB_0149b1c8:
            local_1b0._0_8_ =
                 ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            poVar2 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"ERROR: at group ",0x10);
            iVar10 = CONCAT31((int3)(uVar11 >> 8),uVar9);
            std::ostream::operator<<(poVar2,(int)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,", invocation ",0xd);
            std::ostream::operator<<(poVar2,(int)uVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,": found unexpected value ",0x19);
            std::ostream::operator<<(poVar2,local_20c);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0149b261;
          }
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < (int)local_20c]) {
            if ((int)local_20c <= (int)*(size_t *)(p_Var6 + 1)) {
              p_Var4 = p_Var6;
            }
          }
          p_Var7 = p_Var1;
          if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
             (p_Var7 = (_Rb_tree_header *)p_Var4,
             (int)local_20c < (int)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
            p_Var7 = p_Var1;
          }
          if (p_Var7 != p_Var1) goto LAB_0149b1c8;
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_1e0,(int *)&local_20c);
          uVar8 = uVar8 + 1;
        } while (uVar8 != local_1f0);
      }
      uVar8 = local_208;
      uVar13 = (undefined7)(uVar12 >> 8);
      if ((iVar3 < 0) ||
         (p_Var4 = &p_Var1->_M_header,
         p_Var6 = local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent, (int)uVar14 < iVar3))
      {
LAB_0149b295:
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"ERROR: at group ",0x10);
        iVar10 = (int)CONCAT71(uVar13,uVar9);
        std::ostream::operator<<(poVar2,(int)local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,": unexpected final value",0x18);
        std::ostream::operator<<(poVar2,iVar3);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0149b261:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_1e0);
        return iVar10;
      }
      for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar3])
      {
        if (iVar3 <= (int)p_Var6[1]._M_color) {
          p_Var4 = p_Var6;
        }
      }
      p_Var6 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (p_Var6 = p_Var4, iVar3 < (int)p_Var4[1]._M_color)) {
        p_Var6 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 != p_Var1) goto LAB_0149b295;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_1e0);
      local_208 = uVar8 + 1;
      uVar12 = CONCAT71(uVar13,local_1f8 <= local_208);
      iVar10 = (int)uVar12;
    } while (local_208 != local_1f8);
  }
  return iVar10;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		DE_UNREF(inputStride && inputs);

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<int>	usedValues;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int outputValue = *(const deInt32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!de::inRange(outputValue, 0, workGroupSize) || usedValues.find(outputValue) != usedValues.end())
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << outputValue
									   << TestLog::EndMessage;
					return false;
				}
				usedValues.insert(outputValue);
			}

			if (!de::inRange(groupOutput, 0, workGroupSize) || usedValues.find(groupOutput) != usedValues.end())
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": unexpected final value" << groupOutput << TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}